

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::FiberStack::runOne(FiberStack *this)

{
  SynchronousFunc *pSVar1;
  Tag TVar2;
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *this_00;
  SynchronousFunc **ppSVar3;
  ArrayDisposer *pAVar4;
  NullableValue<kj::Exception> *other;
  Exception *pEVar5;
  FunctionParam<void_()> *extraout_RDX;
  FunctionParam<void_()> *func_00;
  FunctionParam<void_()> *extraout_RDX_00;
  Exception *exception;
  Maybe<kj::Exception> local_368;
  undefined1 local_1d0 [8];
  NullableValue<kj::Exception> _exception1534;
  SynchronousFunc **_kj_switch_done_1;
  SynchronousFunc **func;
  FiberBase **_kj_switch_done;
  FiberBase **event;
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *_kj_switch_subject;
  FiberStack *this_local;
  
  this_00 = OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>::_switchSubject
                      (&this->main);
  TVar2 = OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>::which(this_00);
  if (TVar2 == _variant0) {
    ppSVar3 = (SynchronousFunc **)
              OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>::get<kj::_::FiberBase*>
                        ((OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*> *)this_00);
    func = ppSVar3;
    while (func != (SynchronousFunc **)0x0) {
      FiberBase::run((FiberBase *)*ppSVar3);
      func = (SynchronousFunc **)0x0;
    }
  }
  else if (TVar2 == _variant1) {
    pAVar4 = (ArrayDisposer *)
             OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>::
             get<kj::_::FiberStack::SynchronousFunc*>
                       ((OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*> *)this_00);
    func_00 = extraout_RDX;
    _exception1534.field_1.value.details.builder.disposer = pAVar4;
    while (_exception1534.field_1.value.details.builder.disposer != (ArrayDisposer *)0x0) {
      runCatchingExceptions<kj::FunctionParam<void()>&>
                (&local_368,(kj *)((SynchronousFunc *)pAVar4->_vptr_ArrayDisposer)->func,func_00);
      other = readMaybe<kj::Exception>(&local_368);
      NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1d0,other);
      Maybe<kj::Exception>::~Maybe(&local_368);
      pEVar5 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1d0);
      if (pEVar5 != (Exception *)0x0) {
        pEVar5 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1d0);
        pSVar1 = (SynchronousFunc *)pAVar4->_vptr_ArrayDisposer;
        pEVar5 = mv<kj::Exception>(pEVar5);
        Maybe<kj::Exception>::emplace<kj::Exception>(&pSVar1->exception,pEVar5);
      }
      NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1d0);
      func_00 = extraout_RDX_00;
      _exception1534.field_1.value.details.builder.disposer = (ArrayDisposer *)0x0;
    }
  }
  return;
}

Assistant:

void FiberStack::runOne() {
  KJ_SWITCH_ONEOF(main) {
    KJ_CASE_ONEOF(event, FiberBase*) {
      event->run();
    }
    KJ_CASE_ONEOF(func, SynchronousFunc*) {
      KJ_IF_SOME(exception, kj::runCatchingExceptions(func->func)) {
        func->exception.emplace(kj::mv(exception));
      }
    }
  }
}